

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::CommandCompare::compareDFDBasic
          (CommandCompare *this,PrintDiff *diff,uint32_t blockIndex,optional<ktx::BDFD> *bdfds,
          optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *bdfdSamples)

{
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view jsonPathIn_02;
  string_view jsonPathIn_03;
  string_view jsonPathIn_04;
  string_view jsonPathIn_05;
  string_view jsonPathIn_06;
  string_view jsonPathIn_07;
  string_view textHeaderIn;
  string_view jsonPathIn_08;
  string_view jsonPathIn_09;
  string_view jsonPathIn_10;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view textHeaderIn_02;
  string_view jsonPathIn_11;
  string_view textHeaderIn_03;
  string_view textHeaderIn_04;
  string_view textHeaderIn_05;
  string_view textHeaderIn_06;
  string_view textHeaderIn_07;
  string_view textHeaderIn_08;
  string_view textHeaderIn_09;
  string_view textHeaderIn_10;
  string_view textHeaderIn_11;
  _Optional_payload_base<int> *p_Var1;
  _Optional_payload_base<int> *p_Var2;
  undefined8 uVar3;
  PrintDiff *pPVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  BDFD *pBVar8;
  unsigned_long *puVar9;
  vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *pvVar10;
  size_type sVar11;
  SampleType *pSVar12;
  size_t sVar13;
  PrintDiff *in_RSI;
  v10 *pvVar14;
  char *pcVar15;
  long in_RDI;
  undefined1 auVar16 [16];
  size_t i_3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lengthAndOffset [2];
  uint32_t flags;
  size_t i_2;
  optional<unsigned_int> qualifierFlags [2];
  size_t i_1;
  optional<ktx::SampleType> samples [2];
  size_t sampleIndex;
  size_t maxNumSamples;
  size_t i;
  optional<int> *in_stack_ffffffffffffe548;
  optional<int> *poVar17;
  int *piVar18;
  array<unsigned_int,_4UL> *paVar19;
  string *ctx;
  uint *puVar20;
  code *in_stack_ffffffffffffe550;
  PrintDiff *this_00;
  code *this_01;
  DiffTextCustom *in_stack_ffffffffffffe558;
  undefined8 in_stack_ffffffffffffe560;
  optional<std::array<unsigned_int,_4UL>_> *in_stack_ffffffffffffe578;
  undefined8 in_stack_ffffffffffffe580;
  _Optional_payload_base<int> *in_stack_ffffffffffffe588;
  undefined8 in_stack_ffffffffffffe590;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe598;
  undefined8 in_stack_ffffffffffffe5a0;
  unsigned_long **in_stack_ffffffffffffe5a8;
  optional<std::array<unsigned_int,_4UL>_> *in_stack_ffffffffffffe5b0;
  _func_char_ptr_uint32_t_bool *in_stack_ffffffffffffe5b8;
  optional<int> *in_stack_ffffffffffffe5c0;
  function<const_char_*(unsigned_long)> *in_stack_ffffffffffffe5c8;
  function<const_char_*(unsigned_long)> *local_1a28;
  function<const_char_*(unsigned_long)> *local_19f8;
  DiffBase<std::array<unsigned_int,_4UL>_> *in_stack_ffffffffffffe648;
  DiffBase<std::array<unsigned_int,_4UL>_> *diff_00;
  PrintDiff *in_stack_ffffffffffffe650;
  PrintDiff *local_19a0;
  undefined1 *local_1980;
  size_type local_1960;
  size_type local_1958;
  undefined1 local_18b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18a0;
  string local_1890 [32];
  undefined1 local_1870 [16];
  v10 local_1850 [8];
  format_args in_stack_ffffffffffffe7b8;
  string_view in_stack_ffffffffffffe7c8;
  uint local_1810 [4];
  optional<std::array<unsigned_int,_4UL>_> local_1800 [2];
  undefined1 local_17d0 [16];
  uint local_1770;
  uint local_176c;
  uint local_1768;
  uint local_1764;
  uint local_1760 [5];
  uint local_174c;
  uint local_1748;
  uint local_1744;
  uint local_1740;
  _Optional_payload_base<int> local_1728;
  undefined8 local_1720;
  string local_1718 [32];
  undefined1 local_16f8 [16];
  uint local_1680;
  array<unsigned_int,_4UL> local_167c;
  undefined1 local_1668 [48];
  undefined1 local_1638 [16];
  basic_string_view<char,_std::char_traits<char>_> local_1628 [5];
  uint local_15d8;
  int local_15d4 [2];
  uint local_15cc;
  unsigned_long *local_15c0;
  undefined8 local_15b8;
  string local_15b0 [32];
  undefined1 local_1590 [16];
  basic_string_view<char,_std::char_traits<char>_> local_1580 [10];
  uint local_14d8;
  int local_14d4;
  uint *local_14d0;
  size_t local_14c8;
  string local_14c0 [32];
  ulong local_14a0;
  function<const_char_*(unsigned_long)> local_1498 [2];
  undefined1 auStack_1448 [56];
  uint local_1410;
  array<unsigned_int,_4UL> local_140c;
  unsigned_long *local_13f8 [2];
  string local_13e8 [32];
  undefined1 local_13c8 [16];
  DiffEnum<_khr_df_model_channels_e> local_13a8;
  unsigned_long *local_1358 [2];
  DiffBase<std::array<unsigned_int,_4UL>_> local_1348;
  undefined8 local_12bc;
  uint local_12b4;
  ulong local_12b0;
  undefined1 local_12a8 [72];
  undefined1 auStack_1260 [8];
  pointer local_1258 [2];
  string local_1248 [32];
  undefined1 local_1228 [16];
  size_type local_1218;
  ulong local_1210;
  allocator<char> local_1201;
  string local_1200 [38];
  undefined1 local_11da [18];
  char *local_11c8 [2];
  string local_11b8 [32];
  undefined1 local_1198 [16];
  uint local_1138;
  uint local_1134;
  uint local_1130;
  uint local_112c;
  string local_1128;
  uint local_1108;
  char *local_10f0 [2];
  string local_10e0 [32];
  undefined1 local_10c0 [16];
  undefined1 *local_1048;
  undefined1 local_1040 [56];
  char *local_1008 [2];
  string local_ff8 [32];
  undefined1 local_fd8 [16];
  undefined1 *local_f68;
  optional<int> local_f60 [4];
  uint local_f40;
  int local_f3c [2];
  uint local_f34;
  char *local_f28 [2];
  string local_f18 [32];
  undefined1 local_ef8 [16];
  undefined1 *local_e88;
  optional<int> local_e80 [4];
  uint local_e60;
  int local_e5c [2];
  uint local_e54;
  char *local_e48 [2];
  string local_e38 [32];
  undefined1 local_e18 [16];
  uint local_d98;
  optional<int> local_d8c;
  uint local_d84;
  char *local_d70 [2];
  string local_d60 [32];
  undefined1 local_d40 [16];
  ulong local_cd8;
  undefined1 local_cc8 [12];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> local_cbc
  ;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_ca8 [2];
  undefined8 local_c98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_c90;
  char *local_c88;
  size_t local_c80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c78;
  char *local_c70;
  size_t sStack_c68;
  string *local_c60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c58 [2];
  undefined8 local_c48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_c40;
  char *local_c38;
  size_t local_c30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c28;
  char *local_c20;
  size_t sStack_c18;
  string *local_c10;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c08 [2];
  undefined8 local_bf8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_bf0;
  char *local_be8;
  size_t local_be0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_bd8;
  char *local_bd0;
  size_t sStack_bc8;
  string *local_bc0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_bb8 [2];
  undefined8 local_ba8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_ba0;
  char *local_b98;
  size_t local_b90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_b88;
  char *local_b80;
  size_t sStack_b78;
  string *local_b70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_b68 [2];
  undefined8 local_b58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_b50;
  char *local_b48;
  size_t local_b40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_b38;
  char *local_b30;
  size_t sStack_b28;
  string *local_b20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_b18 [2];
  undefined8 local_b08;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_b00;
  char *local_af8;
  size_t local_af0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_ae8;
  char *local_ae0;
  size_t sStack_ad8;
  string *local_ad0;
  char *local_ac8;
  char **local_ac0;
  char *local_ab8;
  char **local_ab0;
  char *local_aa8;
  char **local_aa0;
  char *local_a98;
  char **local_a90;
  char *local_a88;
  char **local_a80;
  char *local_a78;
  char **local_a70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_a68 [2];
  undefined8 local_a58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_a50;
  pointer local_a48;
  size_t local_a40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_a38;
  pointer local_a30;
  size_t sStack_a28;
  string *local_a20;
  char *local_a18;
  pointer *local_a10;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_a08;
  undefined8 local_9e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_9d8;
  unsigned_long *local_9d0;
  size_t local_9c8;
  uint *local_9c0;
  v10 *local_9b8;
  unsigned_long *local_9b0;
  size_t sStack_9a8;
  string *local_9a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_998;
  undefined8 local_970;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_968;
  unsigned_long *local_960;
  uint *local_950;
  v10 *local_948;
  unsigned_long *local_940;
  undefined8 uStack_938;
  bool *local_930;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_928;
  undefined8 local_900;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_8f8;
  _Optional_payload_base<int> local_8f0;
  uint *local_8e0;
  v10 *local_8d8;
  _Optional_payload_base<int> local_8d0;
  undefined8 uStack_8c8;
  string *local_8c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_8b8;
  undefined8 local_890;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_888;
  unsigned_long *local_880;
  uint *local_870;
  v10 *local_868;
  unsigned_long *local_860;
  size_type sStack_858;
  undefined1 *local_850;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_848;
  undefined8 local_820;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_818;
  unsigned_long *local_810;
  uint *local_800;
  v10 *local_7f8;
  unsigned_long *local_7f0;
  undefined8 uStack_7e8;
  string *local_7e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_7d8;
  undefined8 local_7b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_7a8;
  unsigned_long *local_7a0;
  size_t local_798;
  uint *local_790;
  v10 *local_788;
  unsigned_long *local_780;
  size_t sStack_778;
  string *local_770;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  local_768;
  undefined8 local_740;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_738;
  unsigned_long *local_730;
  size_t local_728;
  uint *local_720;
  v10 *local_718;
  unsigned_long *local_710;
  size_t sStack_708;
  DiffBase<std::array<unsigned_int,_4UL>_> *local_700;
  char *local_6f8;
  unsigned_long **local_6f0;
  char *local_6e8;
  unsigned_long **local_6e0;
  char *local_6d8;
  optional<std::array<unsigned_int,_4UL>_> *local_6d0;
  char *local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_6c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  local_6b8;
  undefined8 local_698;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_690;
  uint *local_688;
  size_t local_680;
  uint *local_678;
  v10 *local_670;
  uint *local_668;
  size_t sStack_660;
  string *local_658;
  char *local_650;
  uint **local_648;
  char *local_640;
  unsigned_long **local_638;
  char *local_630;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_628;
  char *local_620;
  _Optional_payload_base<int> *local_618;
  char *local_610;
  _Optional_payload_base<int> *local_608;
  char *local_600;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5f8;
  char *local_5f0;
  unsigned_long **local_5e8;
  char *local_5e0;
  uint **local_5d8;
  char *local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_5c8;
  char *local_5c0;
  optional<std::array<unsigned_int,_4UL>_> *local_5b8;
  char *local_5b0;
  unsigned_long **local_5a8;
  char *local_5a0;
  unsigned_long **local_598;
  char *local_590;
  pointer *local_588;
  char *local_580;
  char **local_578;
  char *local_570;
  char **local_568;
  char *local_560;
  char **local_558;
  char *local_550;
  char **local_548;
  char *local_540;
  char **local_538;
  char *local_530;
  char **local_528;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_520;
  undefined8 *local_518;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_510;
  undefined8 local_508;
  undefined8 *local_500;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_4f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_4f0;
  undefined8 *local_4e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_4e0;
  undefined8 local_4d8;
  undefined8 *local_4d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_4c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_4c0;
  undefined8 *local_4b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_4b0;
  undefined8 local_4a8;
  undefined8 *local_4a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_498;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_490;
  undefined8 *local_488;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_480;
  undefined8 local_478;
  undefined8 *local_470;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_468;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_460;
  undefined8 *local_458;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_450;
  undefined8 local_448;
  undefined8 *local_440;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_438;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_430;
  undefined8 *local_428;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_420;
  undefined8 local_418;
  undefined8 *local_410;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_408;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_400;
  undefined8 *local_3f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_3f0;
  undefined8 local_3e8;
  undefined8 *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_3d8;
  char **local_3d0;
  char *local_3c8;
  size_t sStack_3c0;
  char **local_3b0;
  char *local_3a8;
  size_t sStack_3a0;
  char **local_390;
  char *local_388;
  size_t sStack_380;
  char **local_370;
  char *local_368;
  size_t sStack_360;
  char **local_350;
  char *local_348;
  size_t sStack_340;
  char **local_330;
  char *local_328;
  size_t sStack_320;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  pointer *local_2e0;
  pointer local_2d8;
  size_t sStack_2d0;
  char *local_2c8;
  unsigned_long **local_2c0;
  unsigned_long *local_2b8;
  size_t sStack_2b0;
  unsigned_long **local_2a0;
  unsigned_long *local_298;
  size_t sStack_290;
  unsigned_long **local_280;
  unsigned_long *local_278;
  unsigned_long **local_260;
  unsigned_long *local_258;
  _Optional_payload_base<int> *local_240;
  _Optional_payload_base<int> local_238;
  unsigned_long **local_220;
  unsigned_long *local_218;
  unsigned_long **local_200;
  unsigned_long *local_1f8;
  size_t sStack_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_1e0;
  undefined8 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_1c8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_1b0;
  undefined8 *local_1a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_198;
  undefined8 local_190;
  undefined8 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_180;
  undefined8 *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_168;
  undefined8 local_160;
  undefined8 *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_150;
  undefined8 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_138;
  undefined8 local_130;
  undefined8 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_120;
  undefined8 *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_108;
  undefined8 local_100;
  undefined8 *local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_f0;
  undefined8 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_d8;
  undefined8 local_d0;
  undefined8 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_c0;
  undefined8 *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long>
  *local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  uint **local_70;
  uint *local_68;
  size_t sStack_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_50;
  undefined8 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_cd8 = 0;
  local_cbc.data_.args_[0].field_0.int128_value._4_8_ = in_RSI;
  while( true ) {
    if (1 < local_cd8) {
      if (*(int *)(in_RDI + 0xa8) != 1) {
        pvVar14 = (v10 *)0x386d72;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                   (char *)in_stack_ffffffffffffe558);
        local_a80 = local_d70;
        local_a88 = "/dataFormatDescriptor/blocks/{}/flags";
        local_570 = "/dataFormatDescriptor/blocks/{}/flags";
        local_d70[0] = "/dataFormatDescriptor/blocks/{}/flags";
        local_568 = local_a80;
        local_af0 = std::char_traits<char>::length((char_type *)0x161059);
        local_2f0 = local_a88;
        local_ad0 = local_d60;
        local_ae0 = local_d70[0];
        local_ae8 = &local_cbc;
        local_3d0 = &local_ae0;
        local_af8 = local_d70[0];
        sStack_ad8 = local_af0;
        local_3c8 = local_af8;
        sStack_3c0 = local_af0;
        local_b18[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 (local_ae8,pvVar14,(uint *)local_ad0);
        local_518 = &local_b08;
        local_520 = local_b18;
        local_508 = 2;
        local_b08 = 2;
        local_510 = local_520;
        local_500 = local_518;
        local_4f8 = local_520;
        local_b00 = local_520;
        ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
        local_d40 = std::__cxx11::string::operator_cast_to_basic_string_view(local_d60);
        bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x1611ea);
        if (bVar5) {
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x1611fd);
          local_d84 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x18) & 0xff;
          std::optional<int>::optional<int,_true>
                    ((optional<int> *)in_stack_ffffffffffffe550,(int *)in_stack_ffffffffffffe548);
          poVar17 = in_stack_ffffffffffffe548;
        }
        else {
          std::optional<int>::optional((optional<int> *)0x161236);
          poVar17 = in_stack_ffffffffffffe548;
        }
        std::optional<unsigned_int>::optional<int,_true>
                  ((optional<unsigned_int> *)in_stack_ffffffffffffe550,poVar17);
        bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x16125c);
        if (bVar5) {
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x161273);
          local_d98 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x18) & 0xff;
          std::optional<int>::optional<int,_true>
                    ((optional<int> *)in_stack_ffffffffffffe550,(int *)poVar17);
        }
        else {
          std::optional<int>::optional((optional<int> *)0x1612ac);
        }
        in_stack_ffffffffffffe548 = &local_d8c;
        std::optional<unsigned_int>::optional<int,_true>
                  ((optional<unsigned_int> *)in_stack_ffffffffffffe550,poVar17);
        in_stack_ffffffffffffe550 = dfdToStringFlagsBit;
        textHeaderIn._M_str = (char *)in_stack_ffffffffffffe5a0;
        textHeaderIn._M_len = (size_t)in_stack_ffffffffffffe598;
        jsonPathIn._M_str = (char *)in_stack_ffffffffffffe590;
        jsonPathIn._M_len = (size_t)in_stack_ffffffffffffe588;
        DiffFlags::DiffFlags
                  ((DiffFlags *)in_stack_ffffffffffffe580,textHeaderIn,jsonPathIn,
                   (optional<unsigned_int> *)in_stack_ffffffffffffe578,
                   (optional<unsigned_int> *)in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8);
        PrintDiff::operator<<
                  (in_stack_ffffffffffffe650,(DiffBase<unsigned_int> *)in_stack_ffffffffffffe648);
        std::__cxx11::string::~string(local_d60);
      }
      pcVar15 = "Transfer";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                 (char *)in_stack_ffffffffffffe558);
      local_a70 = local_e48;
      local_a78 = "/dataFormatDescriptor/blocks/{}/transferFunction";
      local_580 = "/dataFormatDescriptor/blocks/{}/transferFunction";
      local_e48[0] = "/dataFormatDescriptor/blocks/{}/transferFunction";
      local_578 = local_a70;
      local_b40 = std::char_traits<char>::length((char_type *)0x1613f0);
      local_2e8 = local_a78;
      local_b20 = local_e38;
      local_b30 = local_e48[0];
      local_b38 = &local_cbc;
      local_3b0 = &local_b30;
      local_b48 = local_e48[0];
      sStack_b28 = local_b40;
      local_3a8 = local_b48;
      sStack_3a0 = local_b40;
      local_b68[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               (local_b38,(v10 *)pcVar15,(uint *)local_b20);
      local_4e8 = &local_b58;
      local_4f0 = local_b68;
      local_4d8 = 2;
      local_b58 = 2;
      local_4e0 = local_4f0;
      local_4d0 = local_4e8;
      local_4c8 = local_4f0;
      local_b50 = local_4f0;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
      local_e18 = std::__cxx11::string::operator_cast_to_basic_string_view(local_e38);
      bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x161581);
      if (bVar5) {
        pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x161594);
        local_e54 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x10) & 0xff;
        std::optional<int>::optional<int,_true>
                  ((optional<int> *)in_stack_ffffffffffffe550,(int *)in_stack_ffffffffffffe548);
      }
      else {
        std::optional<int>::optional((optional<int> *)0x1615cd);
      }
      bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x1615de);
      if (bVar5) {
        pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x1615f5);
        local_e60 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x10) & 0xff;
        std::optional<int>::optional<int,_true>
                  ((optional<int> *)in_stack_ffffffffffffe550,(int *)in_stack_ffffffffffffe548);
      }
      else {
        std::optional<int>::optional((optional<int> *)0x16162e);
      }
      local_e88 = local_cc8;
      poVar17 = local_e80;
      std::function<char_const*(unsigned_long)>::
      function<ktx::CommandCompare::compareDFDBasic(ktx::PrintDiff&,unsigned_int,std::optional<ktx::BDFD>*,std::optional<std::vector<ktx::SampleType,std::allocator<ktx::SampleType>>>*)::__0,void>
                ((function<const_char_*(unsigned_long)> *)in_stack_ffffffffffffe560,
                 (anon_class_8_1_a7adef13 *)in_stack_ffffffffffffe558);
      piVar18 = local_e5c;
      textHeaderIn_08._M_str = (char *)in_stack_ffffffffffffe5b0;
      textHeaderIn_08._M_len = (size_t)in_stack_ffffffffffffe5a8;
      jsonPathIn_08._M_str = (char *)in_stack_ffffffffffffe5a0;
      jsonPathIn_08._M_len = (size_t)in_stack_ffffffffffffe598;
      DiffEnum<_khr_df_transfer_e>::DiffEnum
                ((DiffEnum<_khr_df_transfer_e> *)in_stack_ffffffffffffe590,textHeaderIn_08,
                 jsonPathIn_08,(optional<int> *)in_stack_ffffffffffffe588,in_stack_ffffffffffffe5c0,
                 in_stack_ffffffffffffe5c8);
      PrintDiff::operator<<
                (in_stack_ffffffffffffe650,(DiffBase<_khr_df_transfer_e> *)in_stack_ffffffffffffe648
                );
      std::function<const_char_*(unsigned_long)>::~function
                ((function<const_char_*(unsigned_long)> *)0x1616d0);
      std::__cxx11::string::~string(local_e38);
      pvVar14 = (v10 *)0x386855;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                 (char *)in_stack_ffffffffffffe558);
      local_ac0 = local_f28;
      local_ac8 = "/dataFormatDescriptor/blocks/{}/colorPrimaries";
      local_530 = "/dataFormatDescriptor/blocks/{}/colorPrimaries";
      local_f28[0] = "/dataFormatDescriptor/blocks/{}/colorPrimaries";
      local_528 = local_ac0;
      local_b90 = std::char_traits<char>::length((char_type *)0x161768);
      local_310 = local_ac8;
      local_b70 = local_f18;
      local_b80 = local_f28[0];
      local_b88 = &local_cbc;
      local_390 = &local_b80;
      local_b98 = local_f28[0];
      sStack_b78 = local_b90;
      local_388 = local_b98;
      sStack_380 = local_b90;
      local_bb8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               (local_b88,pvVar14,(uint *)local_b70);
      local_4b8 = &local_ba8;
      local_4c0 = local_bb8;
      local_4a8 = 2;
      local_ba8 = 2;
      local_4b0 = local_4c0;
      local_4a0 = local_4b8;
      local_498 = local_4c0;
      local_ba0 = local_4c0;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
      local_ef8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_f18);
      bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x1618f9);
      if (bVar5) {
        pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x16190c);
        local_f34 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 8) & 0xff;
        std::optional<int>::optional<int,_true>(poVar17,piVar18);
      }
      else {
        std::optional<int>::optional((optional<int> *)0x161945);
      }
      bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x161956);
      if (bVar5) {
        pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x16196d);
        local_f40 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 8) & 0xff;
        std::optional<int>::optional<int,_true>(poVar17,piVar18);
      }
      else {
        std::optional<int>::optional((optional<int> *)0x1619a6);
      }
      local_f68 = local_cc8;
      poVar17 = local_f60;
      std::function<char_const*(unsigned_long)>::
      function<ktx::CommandCompare::compareDFDBasic(ktx::PrintDiff&,unsigned_int,std::optional<ktx::BDFD>*,std::optional<std::vector<ktx::SampleType,std::allocator<ktx::SampleType>>>*)::__1,void>
                ((function<const_char_*(unsigned_long)> *)in_stack_ffffffffffffe560,
                 (anon_class_8_1_a7adef13 *)in_stack_ffffffffffffe558);
      piVar18 = local_f3c;
      textHeaderIn_09._M_str = (char *)in_stack_ffffffffffffe5b0;
      textHeaderIn_09._M_len = (size_t)in_stack_ffffffffffffe5a8;
      jsonPathIn_09._M_str = (char *)in_stack_ffffffffffffe5a0;
      jsonPathIn_09._M_len = (size_t)in_stack_ffffffffffffe598;
      DiffEnum<_khr_df_primaries_e>::DiffEnum
                ((DiffEnum<_khr_df_primaries_e> *)in_stack_ffffffffffffe590,textHeaderIn_09,
                 jsonPathIn_09,(optional<int> *)in_stack_ffffffffffffe588,in_stack_ffffffffffffe5c0,
                 in_stack_ffffffffffffe5c8);
      PrintDiff::operator<<
                (in_stack_ffffffffffffe650,
                 (DiffBase<_khr_df_primaries_e> *)in_stack_ffffffffffffe648);
      std::function<const_char_*(unsigned_long)>::~function
                ((function<const_char_*(unsigned_long)> *)0x161a48);
      std::__cxx11::string::~string(local_f18);
      if (*(int *)(in_RDI + 0xa8) != 1) {
        pvVar14 = (v10 *)0x386884;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                   (char *)in_stack_ffffffffffffe558);
        local_aa0 = local_1008;
        local_aa8 = "/dataFormatDescriptor/blocks/{}/colorModel";
        local_550 = "/dataFormatDescriptor/blocks/{}/colorModel";
        local_1008[0] = "/dataFormatDescriptor/blocks/{}/colorModel";
        local_548 = local_aa0;
        local_be0 = std::char_traits<char>::length((char_type *)0x161b5c);
        local_2f8 = local_aa8;
        local_bc0 = local_ff8;
        local_bd0 = local_1008[0];
        local_bd8 = &local_cbc;
        local_370 = &local_bd0;
        local_be8 = local_1008[0];
        sStack_bc8 = local_be0;
        local_368 = local_be8;
        sStack_360 = local_be0;
        local_c08[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 (local_bd8,pvVar14,(uint *)local_bc0);
        local_488 = &local_bf8;
        local_490 = local_c08;
        local_478 = 2;
        local_bf8 = 2;
        local_480 = local_490;
        local_470 = local_488;
        local_468 = local_490;
        local_bf0 = local_490;
        ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
        local_fd8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_ff8);
        bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x161ced);
        if (bVar5) {
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x161d00);
          local_1040._44_4_ = (uint)*(undefined8 *)&pBVar8->field_0x8 & 0xff;
          std::optional<int>::optional<int,_true>(poVar17,piVar18);
        }
        else {
          std::optional<int>::optional((optional<int> *)0x161d35);
        }
        bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x161d46);
        if (bVar5) {
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x161d5d);
          local_1040._32_4_ = (uint)*(undefined8 *)&pBVar8->field_0x8 & 0xff;
          std::optional<int>::optional<int,_true>(poVar17,piVar18);
        }
        else {
          std::optional<int>::optional((optional<int> *)0x161d92);
        }
        local_1048 = local_cc8;
        this_00 = (PrintDiff *)local_1040;
        std::function<char_const*(unsigned_long)>::
        function<ktx::CommandCompare::compareDFDBasic(ktx::PrintDiff&,unsigned_int,std::optional<ktx::BDFD>*,std::optional<std::vector<ktx::SampleType,std::allocator<ktx::SampleType>>>*)::__2,void>
                  ((function<const_char_*(unsigned_long)> *)in_stack_ffffffffffffe560,
                   (anon_class_8_1_a7adef13 *)in_stack_ffffffffffffe558);
        paVar19 = (array<unsigned_int,_4UL> *)(local_1040 + 0x24);
        textHeaderIn_10._M_str = (char *)in_stack_ffffffffffffe5b0;
        textHeaderIn_10._M_len = (size_t)in_stack_ffffffffffffe5a8;
        jsonPathIn_10._M_str = (char *)in_stack_ffffffffffffe5a0;
        jsonPathIn_10._M_len = (size_t)in_stack_ffffffffffffe598;
        DiffEnum<_khr_df_model_e>::DiffEnum
                  ((DiffEnum<_khr_df_model_e> *)in_stack_ffffffffffffe590,textHeaderIn_10,
                   jsonPathIn_10,(optional<int> *)in_stack_ffffffffffffe588,
                   in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5c8);
        PrintDiff::operator<<
                  (in_stack_ffffffffffffe650,(DiffBase<_khr_df_model_e> *)in_stack_ffffffffffffe648)
        ;
        std::function<const_char_*(unsigned_long)>::~function
                  ((function<const_char_*(unsigned_long)> *)0x161e34);
        std::__cxx11::string::~string(local_ff8);
        pcVar15 = "Dimensions";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                   (char *)in_stack_ffffffffffffe558);
        local_ab0 = local_10f0;
        local_ab8 = "/dataFormatDescriptor/blocks/{}/texelBlockDimension";
        local_540 = "/dataFormatDescriptor/blocks/{}/texelBlockDimension";
        local_10f0[0] = "/dataFormatDescriptor/blocks/{}/texelBlockDimension";
        local_538 = local_ab0;
        local_c30 = std::char_traits<char>::length((char_type *)0x161ecc);
        local_308 = local_ab8;
        local_c10 = local_10e0;
        local_c20 = local_10f0[0];
        local_c28 = &local_cbc;
        local_350 = &local_c20;
        local_c38 = local_10f0[0];
        sStack_c18 = local_c30;
        local_348 = local_c38;
        sStack_340 = local_c30;
        local_c58[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 (local_c28,(v10 *)pcVar15,(uint *)local_c10);
        local_458 = &local_c48;
        local_460 = local_c58;
        local_448 = 2;
        local_c48 = 2;
        local_450 = local_460;
        local_440 = local_458;
        local_438 = local_460;
        local_c40 = local_460;
        ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
        local_10c0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_10e0);
        bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x16205d);
        if (bVar5) {
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x162073);
          local_1128.field_2._M_allocated_capacity._4_4_ =
               (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x20) & 0xff;
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x162095);
          local_1128.field_2._8_4_ = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x28) & 0xff
          ;
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x1620b7);
          local_1128.field_2._12_4_ =
               (ushort)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x30) & 0xff;
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x1620d9);
          local_1108 = (uint)(byte)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x38);
          std::optional<std::array<unsigned_int,_4UL>_>::
          optional<std::array<unsigned_int,_4UL>,_true>
                    ((optional<std::array<unsigned_int,_4UL>_> *)this_00,paVar19);
        }
        else {
          std::optional<std::array<unsigned_int,_4UL>_>::optional
                    ((optional<std::array<unsigned_int,_4UL>_> *)0x16210c);
        }
        bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x16211d);
        if (bVar5) {
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x162137);
          local_1138 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x20) & 0xff;
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x16215d);
          local_1134 = (uint)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x28) & 0xff;
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x162183);
          local_1130 = (ushort)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x30) & 0xff;
          pBVar8 = std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x1621a9);
          local_112c = (uint)(byte)((ulong)*(undefined8 *)&pBVar8->field_0x8 >> 0x38);
          std::optional<std::array<unsigned_int,_4UL>_>::
          optional<std::array<unsigned_int,_4UL>,_true>
                    ((optional<std::array<unsigned_int,_4UL>_> *)this_00,paVar19);
        }
        else {
          std::optional<std::array<unsigned_int,_4UL>_>::optional
                    ((optional<std::array<unsigned_int,_4UL>_> *)0x1621dc);
        }
        ctx = &local_1128;
        textHeaderIn_00._M_str = (char *)in_stack_ffffffffffffe5a0;
        textHeaderIn_00._M_len = (size_t)in_stack_ffffffffffffe598;
        jsonPathIn_00._M_str = (char *)in_stack_ffffffffffffe590;
        jsonPathIn_00._M_len = (size_t)in_stack_ffffffffffffe588;
        DiffArray<unsigned_int,_4UL>::DiffArray
                  ((DiffArray<unsigned_int,_4UL> *)in_stack_ffffffffffffe580,textHeaderIn_00,
                   jsonPathIn_00,in_stack_ffffffffffffe578,in_stack_ffffffffffffe5b0);
        PrintDiff::operator<<(in_stack_ffffffffffffe650,in_stack_ffffffffffffe648);
        std::__cxx11::string::~string(local_10e0);
        if ((*(byte *)(in_RDI + 0xac) & 1) == 0) {
          pcVar15 = "Plane bytes";
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                     (char *)in_stack_ffffffffffffe558);
          local_a90 = local_11c8;
          local_a98 = "/dataFormatDescriptor/blocks/{}/bytesPlane";
          local_560 = "/dataFormatDescriptor/blocks/{}/bytesPlane";
          local_11c8[0] = "/dataFormatDescriptor/blocks/{}/bytesPlane";
          local_558 = local_a90;
          local_c80 = std::char_traits<char>::length((char_type *)0x1622e5);
          local_300 = local_a98;
          local_c60 = local_11b8;
          local_c70 = local_11c8[0];
          local_c78 = &local_cbc;
          local_330 = &local_c70;
          local_c88 = local_11c8[0];
          sStack_c68 = local_c80;
          local_328 = local_c88;
          sStack_320 = local_c80;
          local_ca8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                   (local_c78,(v10 *)pcVar15,(uint *)local_c60);
          local_428 = &local_c98;
          local_430 = local_ca8;
          local_418 = 2;
          local_c98 = 2;
          local_420 = local_430;
          local_410 = local_428;
          local_408 = local_430;
          local_c90 = local_430;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          local_1198 = std::__cxx11::string::operator_cast_to_basic_string_view(local_11b8);
          bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x162476);
          if (bVar5) {
            std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x162489);
            std::optional<std::array<unsigned_char,_8UL>_>::
            optional<std::array<unsigned_char,_8UL>_&,_true>
                      ((optional<std::array<unsigned_char,_8UL>_> *)this_00,
                       (array<unsigned_char,_8UL> *)ctx);
          }
          else {
            std::optional<std::array<unsigned_char,_8UL>_>::optional
                      ((optional<std::array<unsigned_char,_8UL>_> *)0x1624ac);
          }
          bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x1624bd);
          if (bVar5) {
            std::optional<ktx::BDFD>::operator->((optional<ktx::BDFD> *)0x1624d4);
            std::optional<std::array<unsigned_char,_8UL>_>::
            optional<std::array<unsigned_char,_8UL>_&,_true>
                      ((optional<std::array<unsigned_char,_8UL>_> *)this_00,
                       (array<unsigned_char,_8UL> *)ctx);
          }
          else {
            std::optional<std::array<unsigned_char,_8UL>_>::optional
                      ((optional<std::array<unsigned_char,_8UL>_> *)0x1624f7);
          }
          ctx = (string *)local_11da;
          textHeaderIn_01._M_str = (char *)in_stack_ffffffffffffe5a0;
          textHeaderIn_01._M_len = (size_t)in_stack_ffffffffffffe598;
          jsonPathIn_01._M_str = (char *)in_stack_ffffffffffffe590;
          jsonPathIn_01._M_len = (size_t)in_stack_ffffffffffffe588;
          DiffArray<unsigned_char,_8UL>::DiffArray
                    ((DiffArray<unsigned_char,_8UL> *)in_stack_ffffffffffffe580,textHeaderIn_01,
                     jsonPathIn_01,
                     (optional<std::array<unsigned_char,_8UL>_> *)in_stack_ffffffffffffe578,
                     (optional<std::array<unsigned_char,_8UL>_> *)in_stack_ffffffffffffe5b0);
          PrintDiff::operator<<
                    (in_stack_ffffffffffffe650,
                     (DiffBase<std::array<unsigned_char,_8UL>_> *)in_stack_ffffffffffffe648);
          std::__cxx11::string::~string(local_11b8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe590,(char *)in_stack_ffffffffffffe588,
                   (allocator<char> *)in_stack_ffffffffffffe580);
        PrintDiff::addContext(this_00,ctx);
        std::__cxx11::string::~string(local_1200);
        std::allocator<char>::~allocator(&local_1201);
        bVar5 = std::optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
                has_value((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                           *)0x162662);
        if (bVar5) {
          pvVar10 = std::optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
                    operator->((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                *)0x162675);
          local_1958 = std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::size(pvVar10)
          ;
        }
        else {
          local_1958 = 0;
        }
        local_1218 = local_1958;
        bVar5 = std::optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
                has_value((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                           *)0x1626b4);
        if (bVar5) {
          pvVar10 = std::optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
                    operator->((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                *)0x1626cb);
          local_1960 = std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::size(pvVar10)
          ;
        }
        else {
          local_1960 = 0;
        }
        local_1228._8_8_ = local_1960;
        pvVar14 = (v10 *)(local_1228 + 8);
        puVar9 = std::max<unsigned_long>(&local_1218,(unsigned_long *)pvVar14);
        local_1210 = *puVar9;
        for (local_1228._0_8_ = 0; (ulong)local_1228._0_8_ < local_1210;
            local_1228._0_8_ = (long)(char **)local_1228._0_8_ + 1) {
          local_a10 = local_1258;
          local_a18 = "Sample {}:\n";
          local_590 = "Sample {}:\n";
          local_1258[0] = (pointer)0x38690d;
          local_588 = local_a10;
          local_a40 = std::char_traits<char>::length((char_type *)0x1627b2);
          local_2c8 = local_a18;
          local_a20 = local_1248;
          local_a30 = local_1258[0];
          local_a38 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
                       *)local_1228;
          local_2e0 = &local_a30;
          local_a48 = local_1258[0];
          sStack_a28 = local_a40;
          local_2d8 = local_a48;
          sStack_2d0 = local_a40;
          local_a68[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long>
                                   (local_a38,pvVar14,(unsigned_long *)local_a20);
          local_3f8 = &local_a58;
          local_400 = local_a68;
          local_3e8 = 4;
          local_a58 = 4;
          local_3f0 = local_400;
          local_3e0 = local_3f8;
          local_3d8 = local_400;
          local_a50 = local_400;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          PrintDiff::updateContext(this_00,ctx);
          std::__cxx11::string::~string(local_1248);
          local_1980 = local_12a8 + 0x20;
          do {
            std::optional<ktx::SampleType>::optional((optional<ktx::SampleType> *)0x16297e);
            local_1980 = local_1980 + 0x14;
          } while (local_1980 != auStack_1260);
          for (local_12a8._24_8_ = 0; (ulong)local_12a8._24_8_ < 2;
              local_12a8._24_8_ = local_12a8._24_8_ + 1) {
            bVar5 = std::optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
                    has_value((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                               *)0x1629d6);
            uVar3 = local_1228._0_8_;
            if (bVar5) {
              pvVar10 = std::
                        optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
                        operator->((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                    *)0x162a0b);
              sVar11 = std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::size(pvVar10)
              ;
              if ((ulong)uVar3 < sVar11) {
                pvVar10 = std::
                          optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                          ::operator*((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                       *)0x162a43);
                std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::operator[]
                          (pvVar10,local_1228._0_8_);
                std::optional<ktx::SampleType>::operator=
                          ((optional<ktx::SampleType> *)in_stack_ffffffffffffe560,
                           (SampleType *)in_stack_ffffffffffffe558);
              }
            }
          }
          pPVar4 = (PrintDiff *)local_12a8;
          do {
            local_19a0 = pPVar4;
            std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x162b34);
            pPVar4 = (PrintDiff *)&local_19a0->outputFormat;
          } while (&local_19a0->outputFormat != (OutputFormat *)(local_12a8 + 0x10));
          for (local_12b0 = 0; local_12b0 < 2; local_12b0 = local_12b0 + 1) {
            bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x162b89)
            ;
            if (bVar5) {
              local_12b4 = 0;
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x162bb6);
              uVar7 = 0;
              if ((*(ulong *)pSVar12 >> 0x1c & 1) != 0) {
                uVar7 = 0x10;
              }
              local_12b4 = uVar7 | local_12b4;
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x162bf7);
              uVar7 = 0;
              if ((*(ulong *)pSVar12 >> 0x1d & 1) != 0) {
                uVar7 = 0x20;
              }
              local_12b4 = uVar7 | local_12b4;
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x162c38);
              uVar7 = 0;
              if ((*(ulong *)pSVar12 >> 0x1e & 1) != 0) {
                uVar7 = 0x40;
              }
              local_12b4 = uVar7 | local_12b4;
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x162c79);
              uVar7 = 0;
              if ((*(ulong *)pSVar12 >> 0x1f & 1) != 0) {
                uVar7 = 0x80;
              }
              local_12b4 = uVar7 | local_12b4;
              std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                        ((optional<unsigned_int> *)this_00,(uint *)ctx);
              *(undefined8 *)(local_12a8 + local_12b0 * 8) = local_12bc;
            }
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                     (char *)in_stack_ffffffffffffe558);
          local_6f0 = local_1358;
          local_6f8 = "/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers";
          local_5a0 = "/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers";
          local_1358[0] = (unsigned_long *)0x386928;
          local_598 = local_6f0;
          local_728 = std::char_traits<char>::length((char_type *)0x162d74);
          local_90 = local_6f8;
          diff_00 = &local_1348;
          local_710 = local_1358[0];
          local_718 = (v10 *)&local_cbc;
          local_720 = (uint *)local_1228;
          local_2c0 = &local_710;
          local_730 = local_1358[0];
          sStack_708 = local_728;
          local_700 = diff_00;
          local_2b8 = local_730;
          sStack_2b0 = local_728;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                    (&local_768,local_718,local_720,local_1358[0]);
          local_1d8 = &local_740;
          local_1c0 = 0x42;
          local_740 = 0x42;
          local_1e0 = &local_768;
          local_1d0 = &local_768;
          local_1c8 = &local_768;
          local_1b8 = local_1d8;
          local_738 = &local_768;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)diff_00);
          piVar18 = (int *)(local_12a8 + 8);
          this_01 = dfdToStringSampleDatatypeQualifiersBit;
          textHeaderIn_02._M_str = (char *)in_stack_ffffffffffffe5a0;
          textHeaderIn_02._M_len = (size_t)in_stack_ffffffffffffe598;
          jsonPathIn_02._M_str = (char *)in_stack_ffffffffffffe590;
          jsonPathIn_02._M_len = (size_t)in_stack_ffffffffffffe588;
          local_1348._32_16_ = auVar16;
          DiffFlags::DiffFlags
                    ((DiffFlags *)in_stack_ffffffffffffe580,textHeaderIn_02,jsonPathIn_02,
                     (optional<unsigned_int> *)in_stack_ffffffffffffe578,
                     (optional<unsigned_int> *)in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5b8);
          PrintDiff::operator<<(local_19a0,(DiffBase<unsigned_int> *)diff_00);
          std::__cxx11::string::~string((string *)&local_1348);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                     (char *)in_stack_ffffffffffffe558);
          local_6e0 = local_13f8;
          local_6e8 = "/dataFormatDescriptor/blocks/{}/samples/{}/channelType";
          local_5b0 = "/dataFormatDescriptor/blocks/{}/samples/{}/channelType";
          local_13f8[0] = (unsigned_long *)0x38696f;
          local_5a8 = local_6e0;
          local_798 = std::char_traits<char>::length((char_type *)0x163017);
          local_78 = local_6e8;
          local_770 = local_13e8;
          local_780 = local_13f8[0];
          local_788 = (v10 *)&local_cbc;
          local_790 = (uint *)local_1228;
          local_2a0 = &local_780;
          local_7a0 = local_13f8[0];
          sStack_778 = local_798;
          local_298 = local_7a0;
          sStack_290 = local_798;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                    (&local_7d8,local_788,local_790,local_13f8[0]);
          local_1a8 = &local_7b0;
          local_1b0 = &local_7d8;
          local_190 = 0x42;
          local_7b0 = 0x42;
          local_1a0 = local_1b0;
          local_198 = local_1b0;
          local_188 = local_1a8;
          local_7a8 = local_1b0;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view(local_13e8);
          local_13c8 = auVar16;
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x1631b8);
          if (bVar5) {
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x1631cb);
            local_140c._M_elems[2] = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x18) & 0xf;
            std::optional<int>::optional<int,_true>((optional<int> *)this_01,piVar18);
          }
          else {
            std::optional<int>::optional((optional<int> *)0x163201);
          }
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x163212);
          if (bVar5) {
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x163229);
            local_1410 = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x18) & 0xf;
            std::optional<int>::optional<int,_true>((optional<int> *)this_01,piVar18);
          }
          else {
            std::optional<int>::optional((optional<int> *)0x16325f);
          }
          auStack_1448._8_8_ = local_cc8;
          auStack_1448._16_8_ = local_12a8 + 0x20;
          this_00 = (PrintDiff *)(auStack_1448 + 0x18);
          std::function<char_const*(unsigned_long)>::
          function<ktx::CommandCompare::compareDFDBasic(ktx::PrintDiff&,unsigned_int,std::optional<ktx::BDFD>*,std::optional<std::vector<ktx::SampleType,std::allocator<ktx::SampleType>>>*)::__3,void>
                    ((function<const_char_*(unsigned_long)> *)in_stack_ffffffffffffe560,
                     (anon_class_16_2_e2b4de1f *)in_stack_ffffffffffffe558);
          paVar19 = &local_140c;
          textHeaderIn_11._M_str = (char *)in_stack_ffffffffffffe5b0;
          textHeaderIn_11._M_len = (size_t)in_stack_ffffffffffffe5a8;
          jsonPathIn_11._M_str = (char *)in_stack_ffffffffffffe5a0;
          jsonPathIn_11._M_len = (size_t)in_stack_ffffffffffffe598;
          DiffEnum<_khr_df_model_channels_e>::DiffEnum
                    ((DiffEnum<_khr_df_model_channels_e> *)in_stack_ffffffffffffe590,textHeaderIn_11
                     ,jsonPathIn_11,(optional<int> *)in_stack_ffffffffffffe588,
                     in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5c8);
          DiffEnum<_khr_df_model_channels_e>::outputHexInText(&local_13a8);
          PrintDiff::operator<<(local_19a0,(DiffBase<_khr_df_model_channels_e> *)diff_00);
          std::function<const_char_*(unsigned_long)>::~function
                    ((function<const_char_*(unsigned_long)> *)0x163328);
          std::__cxx11::string::~string(local_13e8);
          if (*(int *)(in_RDI + 0x48) == 0) {
            local_19f8 = local_1498;
            do {
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x163380);
              local_19f8 = (function<const_char_*(unsigned_long)> *)
                           ((long)&local_19f8[1].super__Function_base._M_functor + 8);
            } while (local_19f8 != (function<const_char_*(unsigned_long)> *)auStack_1448);
            for (local_14a0 = 0; local_14a0 < 2; local_14a0 = local_14a0 + 1) {
              bVar5 = std::optional<ktx::SampleType>::has_value
                                ((optional<ktx::SampleType> *)0x1633d5);
              if (bVar5) {
                local_648 = &local_14d0;
                local_650 = "    Length: {} bits Offset: {}";
                local_5e0 = "    Length: {} bits Offset: {}";
                local_14d0 = (uint *)0x3869a6;
                local_5d8 = local_648;
                local_14c8 = std::char_traits<char>::length((char_type *)0x163449);
                local_20 = local_650;
                pSVar12 = std::optional<ktx::SampleType>::operator->
                                    ((optional<ktx::SampleType> *)0x16348f);
                local_14d4 = (byte)pSVar12->field_0x2 + 1;
                pSVar12 = std::optional<ktx::SampleType>::operator->
                                    ((optional<ktx::SampleType> *)0x1634b5);
                local_14d8 = (uint)*(ushort *)pSVar12;
                local_658 = local_14c0;
                local_668 = local_14d0;
                sStack_660 = local_14c8;
                local_670 = (v10 *)&local_14d4;
                local_678 = &local_14d8;
                local_70 = &local_668;
                local_688 = local_14d0;
                local_680 = local_14c8;
                local_68 = local_688;
                sStack_60 = local_680;
                ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int>
                          (&local_6b8,local_670,local_678,local_14d0);
                local_48 = &local_698;
                local_50 = &local_6b8;
                local_30 = 0x22;
                local_698 = 0x22;
                local_40 = local_50;
                local_38 = local_50;
                local_28 = local_48;
                local_690 = local_50;
                ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
                std::optional<std::__cxx11::string>::operator=
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffe560,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe558);
                std::__cxx11::string::~string(local_14c0);
              }
            }
            DiffTextCustom::DiffTextCustom
                      ((DiffTextCustom *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffe590);
            PrintDiff::operator<<((PrintDiff *)in_stack_ffffffffffffe560,in_stack_ffffffffffffe558);
            DiffTextCustom::~DiffTextCustom((DiffTextCustom *)in_stack_ffffffffffffe560);
            local_1a28 = (function<const_char_*(unsigned_long)> *)auStack_1448;
            do {
              in_stack_ffffffffffffe5c8 =
                   (function<const_char_*(unsigned_long)> *)&local_1a28[-2]._M_invoker;
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x163762);
              local_1a28 = in_stack_ffffffffffffe5c8;
            } while (in_stack_ffffffffffffe5c8 != local_1498);
          }
          else {
            in_stack_ffffffffffffe5a0 = local_cbc.data_.args_[0].field_0.int128_value._4_8_;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_1580);
            in_stack_ffffffffffffe5a8 = &local_15c0;
            local_640 = "/dataFormatDescriptor/blocks/{}/samples/{}/bitLength";
            local_5f0 = "/dataFormatDescriptor/blocks/{}/samples/{}/bitLength";
            local_15c0 = (unsigned_long *)0x3869c5;
            local_638 = in_stack_ffffffffffffe5a8;
            local_5e8 = in_stack_ffffffffffffe5a8;
            puVar9 = (unsigned_long *)std::char_traits<char>::length((char_type *)0x163865);
            in_stack_ffffffffffffe5a8[1] = puVar9;
            local_10 = local_640;
            local_7e0 = local_15b0;
            local_7f0 = local_15c0;
            uStack_7e8 = local_15b8;
            local_7f8 = (v10 *)&local_cbc;
            local_800 = (uint *)local_1228;
            local_280 = &local_7f0;
            local_810 = local_15c0;
            local_278 = local_810;
            ::fmt::v10::
            make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                      (&local_848,local_7f8,local_800,local_15c0);
            local_178 = &local_820;
            local_180 = &local_848;
            local_160 = 0x42;
            local_820 = 0x42;
            local_170 = local_180;
            local_168 = local_180;
            local_158 = local_178;
            local_818 = local_180;
            ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
            auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view(local_15b0);
            local_1590 = auVar16;
            bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x163a03)
            ;
            if (bVar5) {
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x163a16);
              local_15cc = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x10) & 0xff;
              std::optional<int>::optional<int,_true>((optional<int> *)this_00,(int *)paVar19);
            }
            else {
              std::optional<int>::optional((optional<int> *)0x163a4e);
            }
            bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x163a5f)
            ;
            if (bVar5) {
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x163a76);
              local_15d8 = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x10) & 0xff;
              std::optional<int>::optional<int,_true>((optional<int> *)this_00,(int *)paVar19);
            }
            else {
              std::optional<int>::optional((optional<int> *)0x163aae);
            }
            piVar18 = local_15d4;
            textHeaderIn_03._M_str = (char *)in_stack_ffffffffffffe5a0;
            textHeaderIn_03._M_len = (size_t)in_stack_ffffffffffffe598;
            jsonPathIn_03._M_str = (char *)in_stack_ffffffffffffe590;
            jsonPathIn_03._M_len = (size_t)in_stack_ffffffffffffe588;
            Diff<int>::Diff((Diff<int> *)in_stack_ffffffffffffe580,textHeaderIn_03,jsonPathIn_03,
                            (optional<int> *)in_stack_ffffffffffffe578,
                            (optional<int> *)in_stack_ffffffffffffe5b0);
            PrintDiff::operator<<(local_19a0,(DiffBase<int> *)diff_00);
            std::__cxx11::string::~string(local_15b0);
            in_stack_ffffffffffffe590 = local_cbc.data_.args_[0].field_0.int128_value._4_8_;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_1628);
            in_stack_ffffffffffffe598 =
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1668;
            local_630 = "/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset";
            local_600 = "/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset";
            local_1668._0_8_ = "/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset";
            local_628 = in_stack_ffffffffffffe598;
            local_5f8 = in_stack_ffffffffffffe598;
            sVar13 = std::char_traits<char>::length((char_type *)0x163b92);
            (in_stack_ffffffffffffe598->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length = sVar13;
            local_18 = local_630;
            local_850 = local_1668 + 0x10;
            local_860 = (unsigned_long *)local_1668._0_8_;
            sStack_858 = local_1668._8_8_;
            local_868 = (v10 *)&local_cbc;
            local_870 = (uint *)local_1228;
            local_260 = &local_860;
            local_880 = (unsigned_long *)local_1668._0_8_;
            local_258 = local_880;
            ::fmt::v10::
            make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                      (&local_8b8,local_868,local_870,(unsigned_long *)local_1668._0_8_);
            local_148 = &local_890;
            local_150 = &local_8b8;
            local_130 = 0x42;
            local_890 = 0x42;
            local_140 = local_150;
            local_138 = local_150;
            local_128 = local_148;
            local_888 = local_150;
            ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
            auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)(local_1668 + 0x10));
            local_1638 = auVar16;
            bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x163d30)
            ;
            if (bVar5) {
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x163d43);
              local_167c._M_elems[2] = (uint)*(undefined8 *)pSVar12 & 0xffff;
              std::optional<int>::optional<int,_true>((optional<int> *)this_00,piVar18);
            }
            else {
              std::optional<int>::optional((optional<int> *)0x163d77);
            }
            bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x163d88)
            ;
            if (bVar5) {
              pSVar12 = std::optional<ktx::SampleType>::operator->
                                  ((optional<ktx::SampleType> *)0x163d9f);
              local_1680 = (uint)*(undefined8 *)pSVar12 & 0xffff;
              std::optional<int>::optional<int,_true>((optional<int> *)this_00,piVar18);
            }
            else {
              std::optional<int>::optional((optional<int> *)0x163dd3);
            }
            paVar19 = &local_167c;
            textHeaderIn_04._M_str = (char *)in_stack_ffffffffffffe5a0;
            textHeaderIn_04._M_len = (size_t)in_stack_ffffffffffffe598;
            jsonPathIn_04._M_str = (char *)in_stack_ffffffffffffe590;
            jsonPathIn_04._M_len = (size_t)in_stack_ffffffffffffe588;
            Diff<int>::Diff((Diff<int> *)in_stack_ffffffffffffe580,textHeaderIn_04,jsonPathIn_04,
                            (optional<int> *)in_stack_ffffffffffffe578,
                            (optional<int> *)in_stack_ffffffffffffe5b0);
            PrintDiff::operator<<(local_19a0,(DiffBase<int> *)diff_00);
            std::__cxx11::string::~string((string *)(local_1668 + 0x10));
          }
          in_stack_ffffffffffffe580 = local_cbc.data_.args_[0].field_0.int128_value._4_8_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                     (char *)in_stack_ffffffffffffe558);
          in_stack_ffffffffffffe588 = &local_1728;
          local_620 = "/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition";
          local_610 = "/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition";
          local_1728 = (_Optional_payload_base<int>)0x386a3c;
          local_618 = in_stack_ffffffffffffe588;
          local_608 = in_stack_ffffffffffffe588;
          sVar13 = std::char_traits<char>::length((char_type *)0x163f0c);
          p_Var1 = in_stack_ffffffffffffe588 + 1;
          p_Var2 = in_stack_ffffffffffffe588 + 1;
          in_stack_ffffffffffffe588[1]._M_payload = (_Storage<int,_true>)(int)sVar13;
          p_Var1->_M_engaged = (bool)(char)(sVar13 >> 0x20);
          *(int3 *)&p_Var2->field_0x5 = (int3)(sVar13 >> 0x28);
          local_8 = local_620;
          local_8c0 = local_1718;
          local_8d0 = local_1728;
          uStack_8c8 = local_1720;
          local_8d8 = (v10 *)&local_cbc;
          local_8e0 = (uint *)local_1228;
          local_240 = &local_8d0;
          local_8f0 = local_1728;
          local_238 = local_8f0;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                    (&local_928,local_8d8,local_8e0,(unsigned_long *)local_1728);
          local_118 = &local_900;
          local_120 = &local_928;
          local_100 = 0x42;
          local_900 = 0x42;
          local_110 = local_120;
          local_108 = local_120;
          local_f8 = local_118;
          local_8f8 = local_120;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1718);
          local_16f8 = auVar16;
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x1640aa);
          if (bVar5) {
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x1640c0);
            local_174c = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x20) & 0xff;
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x1640e1);
            local_1748 = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x28) & 0xff;
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x164102);
            local_1744 = (ushort)((ulong)*(undefined8 *)pSVar12 >> 0x30) & 0xff;
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x164123);
            local_1740 = (uint)(byte)((ulong)*(undefined8 *)pSVar12 >> 0x38);
            std::optional<std::array<unsigned_int,_4UL>_>::
            optional<std::array<unsigned_int,_4UL>,_true>
                      ((optional<std::array<unsigned_int,_4UL>_> *)this_00,paVar19);
          }
          else {
            std::optional<std::array<unsigned_int,_4UL>_>::optional
                      ((optional<std::array<unsigned_int,_4UL>_> *)0x164155);
          }
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x164166);
          if (bVar5) {
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x164180);
            local_1770 = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x20) & 0xff;
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x1641a5);
            local_176c = (uint)((ulong)*(undefined8 *)pSVar12 >> 0x28) & 0xff;
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x1641ca);
            local_1768 = (ushort)((ulong)*(undefined8 *)pSVar12 >> 0x30) & 0xff;
            pSVar12 = std::optional<ktx::SampleType>::operator->
                                ((optional<ktx::SampleType> *)0x1641ef);
            local_1764 = (uint)(byte)((ulong)*(undefined8 *)pSVar12 >> 0x38);
            std::optional<std::array<unsigned_int,_4UL>_>::
            optional<std::array<unsigned_int,_4UL>,_true>
                      ((optional<std::array<unsigned_int,_4UL>_> *)this_00,paVar19);
          }
          else {
            std::optional<std::array<unsigned_int,_4UL>_>::optional
                      ((optional<std::array<unsigned_int,_4UL>_> *)0x164221);
          }
          puVar20 = local_1760;
          textHeaderIn_05._M_str = (char *)in_stack_ffffffffffffe5a0;
          textHeaderIn_05._M_len = (size_t)in_stack_ffffffffffffe598;
          jsonPathIn_05._M_str = (char *)in_stack_ffffffffffffe590;
          jsonPathIn_05._M_len = (size_t)in_stack_ffffffffffffe588;
          DiffArray<unsigned_int,_4UL>::DiffArray
                    ((DiffArray<unsigned_int,_4UL> *)in_stack_ffffffffffffe580,textHeaderIn_05,
                     jsonPathIn_05,in_stack_ffffffffffffe578,in_stack_ffffffffffffe5b0);
          PrintDiff::operator<<(local_19a0,diff_00);
          std::__cxx11::string::~string(local_1718);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe560,
                     (char *)in_stack_ffffffffffffe558);
          in_stack_ffffffffffffe578 = local_1800;
          local_6d8 = "/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower";
          local_5c0 = "/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower";
          local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<unsigned_int,_4UL>_>._M_payload._0_8_ =
               "/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower";
          local_6d0 = in_stack_ffffffffffffe578;
          local_5b8 = in_stack_ffffffffffffe578;
          sVar13 = std::char_traits<char>::length((char_type *)0x16430c);
          *(size_t *)
           ((long)&(in_stack_ffffffffffffe578->
                   super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>)._M_payload.
                   super__Optional_payload_base<std::array<unsigned_int,_4UL>_>._M_payload + 8) =
               sVar13;
          local_80 = local_6d8;
          local_930 = &local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>
                       ._M_payload.super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                       _M_engaged;
          local_940 = (unsigned_long *)
                      local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>.
                      _M_payload.super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                      _M_payload._0_8_;
          uStack_938 = local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>
                       ._M_payload.super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                       _M_payload._8_8_;
          local_948 = (v10 *)&local_cbc;
          local_950 = (uint *)local_1228;
          local_220 = &local_940;
          local_960 = (unsigned_long *)
                      local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>.
                      _M_payload.super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                      _M_payload._0_8_;
          local_218 = local_960;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                    (&local_998,local_948,local_950,
                     (unsigned_long *)
                     local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>.
                     _M_payload.super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                     _M_payload._0_8_);
          local_e8 = &local_970;
          local_f0 = &local_998;
          local_d0 = 0x42;
          local_970 = 0x42;
          local_e0 = local_f0;
          local_d8 = local_f0;
          local_c8 = local_e8;
          local_968 = local_f0;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)
                               &local_1800[0].
                                super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>.
                                _M_payload.
                                super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                                _M_engaged);
          local_17d0 = auVar16;
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x1644aa);
          if (bVar5) {
            std::optional<ktx::SampleType>::operator->((optional<ktx::SampleType> *)0x1644bd);
            std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                      ((optional<unsigned_int> *)this_00,puVar20);
          }
          else {
            std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x1644e0);
          }
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x1644f1);
          if (bVar5) {
            std::optional<ktx::SampleType>::operator->((optional<ktx::SampleType> *)0x164508);
            std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                      ((optional<unsigned_int> *)this_00,puVar20);
          }
          else {
            std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x16452b);
          }
          puVar20 = local_1810;
          textHeaderIn_06._M_str = (char *)in_stack_ffffffffffffe5a0;
          textHeaderIn_06._M_len = (size_t)in_stack_ffffffffffffe598;
          jsonPathIn_06._M_str = (char *)in_stack_ffffffffffffe590;
          jsonPathIn_06._M_len = (size_t)in_stack_ffffffffffffe588;
          DiffHexFixedWidth<unsigned_int>::DiffHexFixedWidth
                    ((DiffHexFixedWidth<unsigned_int> *)in_stack_ffffffffffffe580,textHeaderIn_06,
                     jsonPathIn_06,(optional<unsigned_int> *)in_stack_ffffffffffffe578,
                     (optional<unsigned_int> *)in_stack_ffffffffffffe5b0);
          PrintDiff::operator<<(local_19a0,(DiffBase<unsigned_int> *)diff_00);
          std::__cxx11::string::~string
                    ((string *)
                     &local_1800[0].super__Optional_base<std::array<unsigned_int,_4UL>,_true,_true>.
                      _M_payload.super__Optional_payload_base<std::array<unsigned_int,_4UL>_>.
                      _M_engaged);
          in_stack_ffffffffffffe560 = local_cbc.data_.args_[0].field_0.int128_value._4_8_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     local_cbc.data_.args_[0].field_0.int128_value._4_8_,
                     (char *)in_stack_ffffffffffffe558);
          local_6c0 = &local_18a0;
          local_6c8 = "/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper";
          local_5d0 = "/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper";
          local_18a0._M_allocated_capacity = 0x386ac1;
          local_5c8 = local_6c0;
          local_9c8 = std::char_traits<char>::length((char_type *)0x164616);
          local_88 = local_6c8;
          local_9a0 = local_1890;
          local_9b0 = (unsigned_long *)local_18a0._M_allocated_capacity;
          local_9b8 = (v10 *)&local_cbc;
          local_9c0 = (uint *)local_1228;
          local_200 = &local_9b0;
          local_9d0 = (unsigned_long *)local_18a0._M_allocated_capacity;
          sStack_9a8 = local_9c8;
          local_1f8 = local_9d0;
          sStack_1f0 = local_9c8;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long>
                    (&local_a08,local_9b8,local_9c0,
                     (unsigned_long *)local_18a0._M_allocated_capacity);
          local_b8 = &local_9e0;
          local_c0 = &local_a08;
          local_a0 = 0x42;
          local_9e0 = 0x42;
          local_b0 = local_c0;
          local_a8 = local_c0;
          local_98 = local_b8;
          local_9d8 = local_c0;
          ::fmt::v10::vformat_abi_cxx11_(in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7b8);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1890);
          local_1870 = auVar16;
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x1647b4);
          if (bVar5) {
            std::optional<ktx::SampleType>::operator->((optional<ktx::SampleType> *)0x1647c7);
            std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                      ((optional<unsigned_int> *)this_00,puVar20);
          }
          else {
            std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x1647ea);
          }
          bVar5 = std::optional<ktx::SampleType>::has_value((optional<ktx::SampleType> *)0x1647fb);
          if (bVar5) {
            std::optional<ktx::SampleType>::operator->((optional<ktx::SampleType> *)0x164812);
            std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                      ((optional<unsigned_int> *)this_00,puVar20);
          }
          else {
            std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x164835);
          }
          ctx = (string *)local_18b0;
          textHeaderIn_07._M_str = (char *)in_stack_ffffffffffffe5a0;
          textHeaderIn_07._M_len = (size_t)in_stack_ffffffffffffe598;
          jsonPathIn_07._M_str = (char *)in_stack_ffffffffffffe590;
          jsonPathIn_07._M_len = (size_t)in_stack_ffffffffffffe588;
          DiffHexFixedWidth<unsigned_int>::DiffHexFixedWidth
                    ((DiffHexFixedWidth<unsigned_int> *)in_stack_ffffffffffffe580,textHeaderIn_07,
                     jsonPathIn_07,(optional<unsigned_int> *)in_stack_ffffffffffffe578,
                     (optional<unsigned_int> *)in_stack_ffffffffffffe5b0);
          pvVar14 = local_1850;
          PrintDiff::operator<<(local_19a0,(DiffBase<unsigned_int> *)diff_00);
          std::__cxx11::string::~string(local_1890);
        }
      }
      return;
    }
    bVar5 = std::optional<ktx::BDFD>::has_value((optional<ktx::BDFD> *)0x160f42);
    bVar6 = std::optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>::
            has_value((optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *)
                      0x160f6a);
    if (bVar5 != bVar6) break;
    local_cd8 = local_cd8 + 1;
  }
  __assert_fail("bdfds[i].has_value() == bdfdSamples[i].has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                ,0x691,
                "void ktx::CommandCompare::compareDFDBasic(PrintDiff &, uint32_t, std::optional<BDFD> *, std::optional<std::vector<SampleType>> *)"
               );
}

Assistant:

void CommandCompare::compareDFDBasic(PrintDiff& diff, uint32_t blockIndex,
    std::optional<BDFD> bdfds[2], std::optional<std::vector<SampleType>> bdfdSamples[2]) {
    for (std::size_t i = 0; i < 2; ++i)
        assert(bdfds[i].has_value() == bdfdSamples[i].has_value());

    if (options.ignoreDFD != IgnoreDFD::all_except_color_space)
        diff << DiffFlags("Flags",
            fmt::format("/dataFormatDescriptor/blocks/{}/flags", blockIndex),
            OPT_BITFIELDS(bdfds, flags), dfdToStringFlagsBit);

    diff << DiffEnum<khr_df_transfer_e>("Transfer",
        fmt::format("/dataFormatDescriptor/blocks/{}/transferFunction", blockIndex),
        OPT_BITFIELDS(bdfds, transfer),
        [&](auto i) { return dfdToStringTransferFunction(khr_df_transfer_e(bdfds[i]->transfer)); });
    diff << DiffEnum<khr_df_primaries_e>("Primaries",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorPrimaries", blockIndex),
        OPT_BITFIELDS(bdfds, primaries),
        [&](auto i) { return dfdToStringColorPrimaries(khr_df_primaries_e(bdfds[i]->primaries)); });

    // Do not compare the remainder of the BDFD if everything but color space information is ignored
    if (options.ignoreDFD == IgnoreDFD::all_except_color_space)
        return;

    diff << DiffEnum<khr_df_model_e>("Model",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorModel", blockIndex),
        OPT_BITFIELDS(bdfds, model),
        [&](auto i) { return dfdToStringColorModel(khr_df_model_e(bdfds[i]->model)); });
    diff << DiffArray("Dimensions",
        fmt::format("/dataFormatDescriptor/blocks/{}/texelBlockDimension", blockIndex),
        OPT_UINT4S(bdfds, texelBlockDimension));

    if (!options.ignoreBDFDBytesPlane)
        diff << DiffArray("Plane bytes",
            fmt::format("/dataFormatDescriptor/blocks/{}/bytesPlane", blockIndex),
            OPT_FIELDS(bdfds, bytesPlanes));

    diff.addContext("Sample <i>:\n");

    std::size_t maxNumSamples = std::max(
        bdfdSamples[0].has_value() ? bdfdSamples[0]->size() : 0,
        bdfdSamples[1].has_value() ? bdfdSamples[1]->size() : 0
    );
    for (std::size_t sampleIndex = 0; sampleIndex < maxNumSamples; ++sampleIndex) {
        diff.updateContext(fmt::format("Sample {}:\n", sampleIndex));

        std::optional<SampleType> samples[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (bdfdSamples[i].has_value() && sampleIndex < bdfdSamples[i]->size())
                samples[i] = (*bdfdSamples[i])[sampleIndex];

        std::optional<uint32_t> qualifierFlags[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (samples[i].has_value()) {
                uint32_t flags = 0;
                flags |= samples[i]->qualifierLinear ? KHR_DF_SAMPLE_DATATYPE_LINEAR : 0;
                flags |= samples[i]->qualifierExponent ? KHR_DF_SAMPLE_DATATYPE_EXPONENT : 0;
                flags |= samples[i]->qualifierSigned ? KHR_DF_SAMPLE_DATATYPE_SIGNED : 0;
                flags |= samples[i]->qualifierFloat ? KHR_DF_SAMPLE_DATATYPE_FLOAT : 0;
                qualifierFlags[i] = flags;
            }
        diff << DiffFlags("    Qualifiers",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers", blockIndex, sampleIndex),
            qualifierFlags[0], qualifierFlags[1], dfdToStringSampleDatatypeQualifiersBit);

        diff << DiffEnum<khr_df_model_channels_e>("    Channel Type",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/channelType", blockIndex, sampleIndex),
            OPT_BITFIELDS(samples, channelType),
            [&](auto i) {
                return dfdToStringChannelId(khr_df_model_e(bdfds[i]->model),
                    khr_df_model_channels_e(samples[i]->channelType));
            })
            .outputHexInText();

        // Text output combines length and offset so we have to special-case here
        if (options.format == OutputFormat::text) {
            std::optional<std::string> lengthAndOffset[2] = {};
            for (std::size_t i = 0; i < 2; ++i)
                if (samples[i].has_value())
                    lengthAndOffset[i] = fmt::format("    Length: {} bits Offset: {}",
                        static_cast<uint32_t>(samples[i]->bitLength + 1),
                        static_cast<uint32_t>(samples[i]->bitOffset));
            diff << DiffTextCustom(lengthAndOffset[0], lengthAndOffset[1]);
        } else {
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitLength", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitLength));
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitOffset));
        }

        diff << DiffArray("    Position",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition", blockIndex, sampleIndex),
            OPT_UINT4S(samples, samplePosition));
        diff << DiffHexFixedWidth("    Lower",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower", blockIndex, sampleIndex),
            OPT_FIELDS(samples, lower));
        diff << DiffHexFixedWidth("    Upper",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper", blockIndex, sampleIndex),
            OPT_FIELDS(samples, upper));
    }
}